

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckAnchorAccess(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ctmbstr ptVar6;
  ctmbstr word_1;
  ctmbstr word;
  tmbchar local_48 [4];
  int errcode;
  tmbchar ext [20];
  Bool HasTriggeredLink;
  Bool HasDescription;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  for (_HasTriggeredLink = node->attributes; _HasTriggeredLink != (AttVal *)0x0;
      _HasTriggeredLink = _HasTriggeredLink->next) {
    BVar2 = Level1_Enabled(doc);
    if ((((BVar2 != no) && (_HasTriggeredLink != (AttVal *)0x0)) &&
        (_HasTriggeredLink->dict != (Attribute *)0x0)) &&
       ((_HasTriggeredLink->dict->id == TidyAttr_HREF &&
        (BVar2 = hasValue(_HasTriggeredLink), BVar2 != no)))) {
      GetFileExtension(_HasTriggeredLink->value,local_48,0x14);
      BVar2 = IsValidMediaExtension(_HasTriggeredLink->value);
      if (BVar2 != no) {
        prvTidyReportAccessError(doc,node,0x2aa);
      }
      uVar3 = prvTidytmbstrlen(local_48);
      if (((uVar3 < 6) && (uVar3 = prvTidytmbstrlen(local_48), uVar3 != 0)) &&
         (uVar3 = IsSoundFile(_HasTriggeredLink->value), uVar3 != 0)) {
        if ((node->next != (Node *)0x0) && (node->next->tag == (Dict *)0x0)) {
          ptVar6 = textFromOneNode(doc,node->next);
          BVar2 = IsWhitespace(ptVar6);
          if (BVar2 == no) {
            bVar1 = true;
          }
        }
        if (!bVar1) {
          prvTidyReportAccessError(doc,node,uVar3);
        }
      }
    }
    BVar2 = Level2_Enabled(doc);
    if ((((BVar2 != no) && (_HasTriggeredLink != (AttVal *)0x0)) &&
        (_HasTriggeredLink->dict != (Attribute *)0x0)) &&
       (_HasTriggeredLink->dict->id == TidyAttr_TARGET)) {
      if (((_HasTriggeredLink == (AttVal *)0x0) || (_HasTriggeredLink->value == (tmbstr)0x0)) ||
         (iVar4 = prvTidytmbstrcasecmp(_HasTriggeredLink->value,"_new"), iVar4 != 0)) {
        if (((_HasTriggeredLink != (AttVal *)0x0) && (_HasTriggeredLink->value != (tmbstr)0x0)) &&
           (iVar4 = prvTidytmbstrcasecmp(_HasTriggeredLink->value,"_blank"), iVar4 == 0)) {
          prvTidyReportAccessError(doc,node,0x2f3);
        }
      }
      else {
        prvTidyReportAccessError(doc,node,0x2f2);
      }
    }
  }
  BVar2 = Level2_Enabled(doc);
  if (BVar2 != no) {
    if ((((node->content != (Node *)0x0) && (node->content->tag == (Dict *)0x0)) &&
        (ptVar6 = textFromOneNode(doc,node->content), ptVar6 != (ctmbstr)0x0)) &&
       (BVar2 = IsWhitespace(ptVar6), BVar2 == no)) {
      iVar4 = prvTidytmbstrcmp(ptVar6,"more");
      iVar5 = prvTidytmbstrcmp(ptVar6,"click here");
      if (iVar5 == 0) {
        prvTidyReportAccessError(doc,node,0x307);
      }
      if ((iVar4 != 0) && (uVar3 = prvTidytmbstrlen(ptVar6), uVar3 < 6)) {
        prvTidyReportAccessError(doc,node,0x304);
      }
      uVar3 = prvTidytmbstrlen(ptVar6);
      if (0x3c < uVar3) {
        prvTidyReportAccessError(doc,node,0x306);
      }
    }
    if (node->content == (Node *)0x0) {
      prvTidyReportAccessError(doc,node,0x305);
    }
  }
  return;
}

Assistant:

static void CheckAnchorAccess( TidyDocImpl* doc, Node* node )
{
    AttVal* av;
    Bool HasDescription = no;
    Bool HasTriggeredLink = no;

    /* Checks for attributes within the ANCHOR element */
    for ( av = node->attributes; av != NULL; av = av->next )
    {
        if (Level1_Enabled( doc ))
        {
            /* Must be of valid sound file type */
            if ( attrIsHREF(av) )
            {
                if ( hasValue(av) )
                {
                    tmbchar ext[ 20 ];
                    GetFileExtension (av->value, ext, sizeof(ext) );

                    /* Checks to see if multimedia is used */
                    if ( IsValidMediaExtension(av->value) )
                    {
                        TY_(ReportAccessError)( doc, node, MULTIMEDIA_REQUIRES_TEXT );
                    }
            
                    /* 
                        Checks for validity of sound file, and checks to see if 
                        the file is described within the document, or by a link
                        that is present which gives the description.
                    */
                    if ( TY_(tmbstrlen)(ext) < 6 && TY_(tmbstrlen)(ext) > 0 )
                    {
                        int errcode = IsSoundFile( av->value );
                        if ( errcode )
                        {
                            if (node->next != NULL)
                            {
                                if (node->next->tag == NULL)
                                {
                                    ctmbstr word = textFromOneNode( doc, node->next);
                                
                                    /* Must contain at least one letter in the text */
                                    if (IsWhitespace (word) == no)
                                    {
                                        HasDescription = yes;
                                    }
                                }
                            }

                            /* Must contain text description of sound file */
                            if ( !HasDescription )
                            {
                                TY_(ReportAccessError)( doc, node, errcode );
                            }
                        }
                    }
                }
            }
        }

        if (Level2_Enabled( doc ))
        {
            /* Checks 'TARGET' attribute for validity if it exists */
            if ( attrIsTARGET(av) )
            {
                if (AttrValueIs(av, "_new"))
                {
                    TY_(ReportAccessError)( doc, node, NEW_WINDOWS_REQUIRE_WARNING_NEW);
                }
                else if (AttrValueIs(av, "_blank"))
                {
                    TY_(ReportAccessError)( doc, node, NEW_WINDOWS_REQUIRE_WARNING_BLANK);
                }
            }
        }
    }
    
    if (Level2_Enabled( doc ))
    {
        if ((node->content != NULL)&&
            (node->content->tag == NULL))
        {
            ctmbstr word = textFromOneNode( doc, node->content);

            if ((word != NULL)&&
                (IsWhitespace (word) == no))
            {
                if (TY_(tmbstrcmp) (word, "more") == 0)
                {
                    HasTriggeredLink = yes;
                }

                if (TY_(tmbstrcmp) (word, "click here") == 0)
                {
                    TY_(ReportAccessError)( doc, node, LINK_TEXT_NOT_MEANINGFUL_CLICK_HERE);
                }

                if (HasTriggeredLink == no)
                {
                    if (TY_(tmbstrlen)(word) < 6)
                    {
                        TY_(ReportAccessError)( doc, node, LINK_TEXT_NOT_MEANINGFUL);
                    }
                }

                if (TY_(tmbstrlen)(word) > 60)
                {
                    TY_(ReportAccessError)( doc, node, LINK_TEXT_TOO_LONG);
                }

            }
        }
        
        if (node->content == NULL)
        {
            TY_(ReportAccessError)( doc, node, LINK_TEXT_MISSING);
        }
    }
}